

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tenor.cpp
# Opt level: O2

string * __thiscall
bidfx_public_api::Tenor::ToString_abi_cxx11_(string *__return_storage_ptr__,Tenor *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  return __return_storage_ptr__;
}

Assistant:

std::string Tenor::ToString() const
{
    return tenor_code_;
}